

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::parse_type(CVmPackPos *p,CVmPackType *info,CVmPackGroup *group)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  long lVar5;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  CVmPackType *in_RDX;
  CVmPackPos *in_RSI;
  CVmPackPos *pCVar6;
  CVmPackPos *in_RDI;
  size_t len;
  wchar_t c;
  CVmPackPos *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  CVmPackPos *p_00;
  
  p_00 = in_RSI;
  wVar1 = CVmPackPos::nextch((CVmPackPos *)in_RDX);
  iVar2 = is_valid_type(L'\0');
  if (iVar2 == 0) {
    pcVar4 = CVmPackPos::index(in_RDI,(char *)in_RSI,__c);
    err_throw_a(0x6b,1,0,(ulong)((int)pcVar4 - 1));
  }
  pcVar4 = CVmPackPos::index(in_RDI,(char *)in_RSI,__c);
  *(int *)&p_00[3].p.p_ = (int)pcVar4 + -1;
  *(wchar_t *)&(p_00->p).p_ = wVar1;
  if (wVar1 != L'\"') {
    if (wVar1 == L'{') {
      pCVar6 = in_RDI;
      CVmPackPos::set((CVmPackPos *)CONCAT44(0x7b,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      while( true ) {
        iVar2 = CVmPackPos::more((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
        if (iVar2 == 0) {
          pcVar4 = CVmPackPos::index(in_RDI,(char *)pCVar6,__c_01);
          err_throw_a(0x6b,1,0,(ulong)pcVar4 & 0xffffffff);
        }
        wVar3 = CVmPackPos::getch((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
        if (wVar3 == L'}') break;
        CVmPackPos::getch((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
        iVar2 = is_xdigit(L'\0');
        if (iVar2 == 0) {
          pcVar4 = CVmPackPos::index(in_RDI,(char *)pCVar6,__c_02);
          err_throw_a(0x6b,0,(ulong)pcVar4 & 0xffffffff);
        }
        CVmPackPos::inc((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
      }
      *(size_t *)&p_00->idx = *(long *)&p_00->idx - in_RDI->len;
      CVmPackPos::inc((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
    }
LAB_0037a64b:
    *(undefined4 *)&p_00[1].len = *(undefined4 *)((long)&(in_RDX->lit).p.p_ + 4);
    *(int *)&p_00[2].len = (int)(in_RDX->lit).len;
    *(undefined4 *)((long)&p_00[2].len + 4) = *(undefined4 *)((long)&(in_RDX->lit).len + 4);
    *(undefined4 *)((long)&p_00[1].len + 4) = 0xffffffff;
    *(undefined4 *)&p_00[1].field_0x14 = 0;
    p_00[1].idx = 0;
    p_00[2].idx = 0;
    *(undefined4 *)((long)&p_00[2].p.p_ + 4) = 0;
    *(undefined4 *)&p_00[2].field_0x14 = 0;
    parse_mods(p_00,in_RDX);
    return;
  }
  pCVar6 = in_RDI;
  CVmPackPos::set((CVmPackPos *)CONCAT44(0x22,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  do {
    iVar2 = CVmPackPos::more((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
    if (iVar2 == 0) {
      pcVar4 = CVmPackPos::index(in_RDI,(char *)pCVar6,__c_00);
      err_throw_a(0x6b,1,0,(ulong)pcVar4 & 0xffffffff);
    }
    wVar3 = CVmPackPos::getch((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
    if (wVar3 == L'\"') {
      lVar5 = *(long *)&p_00->idx - in_RDI->len;
      CVmPackPos::inc((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
      wVar3 = CVmPackPos::getch((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
      if (wVar3 != L'\"') {
        *(long *)&p_00->idx = lVar5;
        goto LAB_0037a64b;
      }
    }
    CVmPackPos::inc((CVmPackPos *)CONCAT44(wVar1,in_stack_ffffffffffffffe0));
  } while( true );
}

Assistant:

void CVmPack::parse_type(CVmPackPos *p, CVmPackType *info,
                         const CVmPackGroup *group)
{
    /* get the type code */
    wchar_t c = p->nextch();
    if (!is_valid_type(c))
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index() - 1);

    /* set the format string index */
    info->fmtidx = p->index() - 1;

    /* this is the type code - save it */
    info->type_code = c;

    /* 
     *   if it's a quote, parse the characters to the next quote; if it's an
     *   open brace, parse the hex digits to the close brace 
     */
    if (c == '"')
    {
        /* note the start of the literal section */
        info->lit.set(p);
        
        /* scan for the closing quote */
        for ( ; ; p->inc())
        {
            /* if at end of string, it's an error */
            if (!p->more())
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* check for the close quote */
            if (p->getch() == '"')
            {
                /* this might be it - note the length if so */
                size_t len = info->lit.len - p->len;

                /* skip it */
                p->inc();

                /* if it's not a stuttered quote, it's really the end */
                if (p->getch() != '"')
                {
                    info->lit.len = len;
                    break;
                }
            }
        }
    }
    else if (c == '{')
    {
        /* note the start of the literal section */
        info->lit.set(p);
        
        /* scan for the closing brace - only hex digits are allowed */
        for ( ; ; p->inc())
        {
            /* if at end of string, it's an error */
            if (!p->more())
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* make sure it's a hex digit or close brace */
            if (p->getch() == '}')
            {
                /* it's the close brace - note it, skip it, and we're done */
                info->lit.len -= p->len;
                p->inc();
                break;
            }
            else if (!is_xdigit(p->getch()))
                err_throw_a(VMERR_PACK_PARSE, ERR_TYPE_INT, p->index());
        }
    }

    /* set the default modifiers */
    info->big_endian = group->big_endian;
    info->tilde = group->tilde;
    info->pct = group->pct;
    info->count = ITER_NONE;
    info->count_as_type = 0;
    info->count_in_bytes = FALSE;
    info->bang = info->qu = FALSE;
    info->null_term = FALSE;

    /* check for modifiers */
    parse_mods(p, info);
}